

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

void sysbvm_dwarf_debugInfo_attribute_endLocationExpression
               (sysbvm_dwarf_debugInfo_builder_t *builder)

{
  bool bVar1;
  size_t sVar2;
  byte local_29;
  
  sVar2 = (builder->locationExpression).size;
  do {
    local_29 = (0x7f < sVar2) << 7 | (byte)sVar2 & 0x7f;
    sysbvm_dynarray_add(&builder->info,&local_29);
    bVar1 = 0x7f < sVar2;
    sVar2 = sVar2 >> 7;
  } while (bVar1);
  sysbvm_dynarray_addAll
            (&builder->info,(builder->locationExpression).size,(builder->locationExpression).data);
  (builder->locationExpression).size = 0;
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_attribute_endLocationExpression(sysbvm_dwarf_debugInfo_builder_t *builder)
{
    sysbvm_dwarf_encodeULEB128(&builder->info, builder->locationExpression.size);
    sysbvm_dynarray_addAll(&builder->info, builder->locationExpression.size, builder->locationExpression.data);
    builder->locationExpression.size = 0;
}